

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

ON_ClippingRegionPoints * __thiscall
ON_ClippingRegionPoints::operator=(ON_ClippingRegionPoints *this,ON_ClippingRegionPoints *src)

{
  uint uVar1;
  double dVar2;
  uint *puVar3;
  double *pdVar4;
  uint *puVar5;
  ON_3dPoint *pOVar6;
  uint *puVar7;
  ON_3dPoint *pOVar8;
  ON_3dPoint *pOVar9;
  
  if (this != src) {
    this->m_point_count = 0;
    this->m_and_clip_flags = 0;
    this->m_or_clip_flags = 0;
    if ((((ulong)src->m_point_count != 0) && (src->m_clip_points != (ON_3dPoint *)0x0)) &&
       (src->m_clip_flags != (uint *)0x0)) {
      ReserveBufferPointCapacity(this,(ulong)src->m_point_count);
      puVar5 = src->m_clip_flags;
      puVar7 = this->m_clip_flags;
      puVar3 = puVar7 + src->m_point_count;
      for (; puVar7 < puVar3; puVar7 = puVar7 + 1) {
        uVar1 = *puVar5;
        puVar5 = puVar5 + 1;
        *puVar7 = uVar1;
      }
      pOVar6 = src->m_clip_points;
      pOVar8 = this->m_clip_points;
      pOVar9 = pOVar8 + src->m_point_count;
      for (; pOVar8 < pOVar9; pOVar8 = pOVar8 + 1) {
        pOVar8->z = pOVar6->z;
        pdVar4 = &pOVar6->x;
        dVar2 = pOVar6->y;
        pOVar6 = pOVar6 + 1;
        pOVar8->x = *pdVar4;
        pOVar8->y = dVar2;
      }
      uVar1 = src->m_point_capacity;
      this->m_point_count = src->m_point_count;
      this->m_point_capacity = uVar1;
      puVar3 = src->m_clip_flags;
      this->m_clip_points = src->m_clip_points;
      this->m_clip_flags = puVar3;
      uVar1 = src->m_or_clip_flags;
      this->m_and_clip_flags = src->m_and_clip_flags;
      this->m_or_clip_flags = uVar1;
    }
  }
  return this;
}

Assistant:

ON_ClippingRegionPoints& ON_ClippingRegionPoints::operator=(const ON_ClippingRegionPoints& src)
{
  if (this != &src)
  {
    Clear();
    if (src.m_point_count > 0 && nullptr != src.m_clip_points && nullptr != src.m_clip_flags)
    {
      ReserveBufferPointCapacity(src.m_point_count);

      const unsigned int* src_f = src.m_clip_flags;
      unsigned int* f = m_clip_flags;
      unsigned int* f1 = f + src.m_point_count;
      while (f < f1 )
        *f++ = *src_f++;

      const ON_3dPoint* src_p = src.m_clip_points;
      ON_3dPoint* p = m_clip_points;
      ON_3dPoint* p1 = p + src.m_point_count;
      while (p < p1)
        *p++ = *src_p++;

      m_point_count = src.m_point_count;
      m_point_capacity = src.m_point_capacity;
      m_clip_points = src.m_clip_points;
      m_clip_flags = src.m_clip_flags;
      m_and_clip_flags = src.m_and_clip_flags;
      m_or_clip_flags = src.m_or_clip_flags;
    }
  }
  return *this;
}